

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.h
# Opt level: O0

NBestGenerator * __thiscall
MeCab::Allocator<mecab_node_t,_mecab_path_t>::nbest_generator
          (Allocator<mecab_node_t,_mecab_path_t> *this)

{
  NBestGenerator *pNVar1;
  NBestGenerator *in_RDI;
  
  pNVar1 = scoped_ptr<MeCab::NBestGenerator>::get
                     ((scoped_ptr<MeCab::NBestGenerator> *)
                      &(in_RDI->freelist_).freeList.
                       super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (pNVar1 == (NBestGenerator *)0x0) {
    pNVar1 = (NBestGenerator *)operator_new(0x60);
    NBestGenerator::NBestGenerator(in_RDI);
    scoped_ptr<MeCab::NBestGenerator>::reset((scoped_ptr<MeCab::NBestGenerator> *)in_RDI,pNVar1);
  }
  pNVar1 = scoped_ptr<MeCab::NBestGenerator>::get
                     ((scoped_ptr<MeCab::NBestGenerator> *)
                      &(in_RDI->freelist_).freeList.
                       super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return pNVar1;
}

Assistant:

NBestGenerator *nbest_generator() {
    if (!nbest_generator_.get()) {
      nbest_generator_.reset(new NBestGenerator);
    }
    return nbest_generator_.get();
  }